

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::rrc_mhl(CPU *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte local_13;
  ushort local_12;
  uint8_t val;
  CPU *pCStack_10;
  uint16_t addr;
  CPU *this_local;
  
  bVar1 = this->regs->l;
  uVar3 = (uint)this->regs->h * 0x100 + (uint)bVar1;
  local_12 = (ushort)uVar3;
  pCStack_10 = this;
  iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)local_12,(ulong)bVar1,(ulong)uVar3);
  local_13 = (byte)iVar2;
  rrc_r8(this,&local_13);
  (*this->mmu->_vptr_IMmu[2])(this->mmu,(ulong)local_12,(ulong)local_13);
  return 4;
}

Assistant:

int CPU::rrc_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    uint8_t val = mmu.read_byte(addr);
    rrc_r8(val);
    mmu.write_byte(addr, val);
    return 4;
}